

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

wchar_t * archive_entry_copy_fflags_text_w(archive_entry *entry,wchar_t *flags)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  wchar_t *pwVar5;
  
  archive_mstring_copy_wcs(&entry->ae_fflags_text,flags);
  do {
    wVar2 = *flags;
    uVar4 = (ulong)(uint)wVar2;
    if (wVar2 < L' ') {
      if (wVar2 != L'\t') {
        if (wVar2 == L'\0') {
          pwVar3 = (wchar_t *)0x0;
          goto LAB_0015f8a0;
        }
LAB_0015f852:
        pwVar3 = (wchar_t *)0x0;
        pwVar5 = flags;
        do {
          while ((0x2c < (uint)uVar4 || ((0x100100000201U >> (uVar4 & 0x3f) & 1) == 0))) {
            pwVar1 = flags + 1;
            flags = flags + 1;
            uVar4 = (ulong)(uint)*pwVar1;
          }
          while( true ) {
            uVar4 = (ulong)(uint)*flags;
            if ((0x2c < uVar4) || ((0x100100000200U >> (uVar4 & 0x3f) & 1) == 0)) break;
            flags = flags + 1;
          }
          if (pwVar3 == (wchar_t *)0x0) {
            pwVar3 = pwVar5;
          }
          pwVar5 = flags;
        } while (*flags != L'\0');
LAB_0015f8a0:
        entry->ae_fflags_set = 0;
        entry->ae_fflags_clear = 0;
        return pwVar3;
      }
    }
    else if ((wVar2 != L' ') && (wVar2 != L',')) goto LAB_0015f852;
    flags = flags + 1;
  } while( true );
}

Assistant:

const wchar_t *
archive_entry_copy_fflags_text_w(struct archive_entry *entry,
    const wchar_t *flags)
{
	archive_mstring_copy_wcs(&entry->ae_fflags_text, flags);
	return (ae_wcstofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}